

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommsInterface.cpp
# Opt level: O3

void __thiscall
helics::CommsInterface::loadNetworkInfo(CommsInterface *this,NetworkBrokerData *netInfo)

{
  char cVar1;
  size_type sVar2;
  int iVar3;
  char cVar4;
  byte bVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  bool bVar6;
  
  cVar4 = '\0';
  while( true ) {
    LOCK();
    cVar1 = (this->operating)._M_base._M_i;
    bVar6 = cVar4 == cVar1;
    if (bVar6) {
      (this->operating)._M_base._M_i = true;
      cVar1 = cVar4;
    }
    cVar4 = cVar1;
    UNLOCK();
    if (bVar6) break;
    if ((this->txStatus)._M_i != STARTUP) {
      return;
    }
  }
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            &this->localTargetAddress;
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (this_00,&netInfo->localInterface);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &this->brokerTargetAddress,&netInfo->brokerAddress);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this->brokerName,
             &netInfo->brokerName);
  this->interfaceNetwork = netInfo->interfaceNetwork;
  iVar3 = netInfo->maxMessageCount;
  this->maxMessageSize = netInfo->maxMessageSize;
  this->maxMessageCount = iVar3;
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &this->brokerInitString,&netInfo->brokerInitString);
  this->autoBroker = netInfo->autobroker;
  this->observer = netInfo->observer;
  bVar5 = netInfo->server_mode - SERVER_DEFAULT_ACTIVE;
  if (bVar5 < 4) {
    this->serverMode = SUB41(0x10001 >> ((bVar5 & 3) << 3),0);
  }
  sVar2 = (netInfo->connectionAddress)._M_string_length;
  if (this->mRequireBrokerConnection == true) {
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              &this->brokerTargetAddress;
    if ((this->brokerTargetAddress)._M_string_length != 0 || sVar2 == 0) goto LAB_00281e4c;
  }
  else if ((this->localTargetAddress)._M_string_length != 0 || sVar2 == 0) goto LAB_00281e4c;
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (this_00,&netInfo->connectionAddress);
LAB_00281e4c:
  LOCK();
  if ((this->operating)._M_base._M_i == true) {
    (this->operating)._M_base._M_i = false;
  }
  UNLOCK();
  return;
}

Assistant:

void CommsInterface::loadNetworkInfo(const NetworkBrokerData& netInfo)
{
    if (propertyLock()) {
        localTargetAddress = netInfo.localInterface;
        brokerTargetAddress = netInfo.brokerAddress;
        brokerName = netInfo.brokerName;
        interfaceNetwork = netInfo.interfaceNetwork;
        maxMessageSize = netInfo.maxMessageSize;
        maxMessageCount = netInfo.maxMessageCount;
        brokerInitString = netInfo.brokerInitString;
        autoBroker = netInfo.autobroker;
        observer = netInfo.observer;
        switch (netInfo.server_mode) {
            case NetworkBrokerData::ServerModeOptions::SERVER_ACTIVE:
            case NetworkBrokerData::ServerModeOptions::SERVER_DEFAULT_ACTIVE:
                serverMode = true;
                break;
            case NetworkBrokerData::ServerModeOptions::SERVER_DEACTIVATED:
            case NetworkBrokerData::ServerModeOptions::SERVER_DEFAULT_DEACTIVATED:
                serverMode = false;
                break;
            case NetworkBrokerData::ServerModeOptions::UNSPECIFIED:
                break;
        }
        if (mRequireBrokerConnection) {
            if (brokerTargetAddress.empty() && !netInfo.connectionAddress.empty()) {
                brokerTargetAddress = netInfo.connectionAddress;
            }
        } else {
            if (localTargetAddress.empty() && !netInfo.connectionAddress.empty()) {
                localTargetAddress = netInfo.connectionAddress;
            }
        }
        propertyUnLock();
    }
}